

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(CodedOutputStream *this,uint64 value)

{
  uint8 *puVar1;
  uint8 bytes [10];
  uint8 local_1a [10];
  
  puVar1 = WriteVarint64ToArray(value,local_1a);
  WriteRaw(this,local_1a,(int)puVar1 - (int)local_1a);
  return;
}

Assistant:

void CodedOutputStream::WriteVarint64SlowPath(uint64 value) {
  uint8 bytes[kMaxVarintBytes];
  uint8* target = &bytes[0];
  uint8* end = WriteVarint64ToArray(value, target);
  int size = end - target;
  WriteRaw(bytes, size);
}